

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void __thiscall v_array<feature_slice>::delete_v(v_array<feature_slice> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  feature_slice *pfVar3;
  
  pfVar3 = this->_begin;
  if (pfVar3 != (feature_slice *)0x0) {
    if (pfVar3 != this->_end) {
      paVar2 = &(pfVar3->space_name).first.field_2;
      do {
        if (paVar2 + 2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)paVar2[1]._M_allocated_capacity) {
          operator_delete((void *)paVar2[1]._M_allocated_capacity);
        }
        pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (paVar2 + -1))->_M_dataplus)._M_p;
        if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar1) {
          operator_delete(pcVar1);
        }
        pfVar3 = (feature_slice *)(paVar2 + 3);
        paVar2 = paVar2 + 5;
      } while (pfVar3 != this->_end);
    }
    free(this->_begin);
  }
  this->_begin = (feature_slice *)0x0;
  this->_end = (feature_slice *)0x0;
  this->end_array = (feature_slice *)0x0;
  return;
}

Assistant:

void delete_v()
  {
    if (_begin != nullptr)
    {
      for (T* item = _begin; item != _end; ++item) item->~T();
      free(_begin);
    }
    _begin = _end = end_array = nullptr;
  }